

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceCase::setVertexFragmentRatio
          (ShaderPerformanceCase *this,float fragmentsPerVertices)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  int precision;
  int precision_00;
  float fVar3;
  string local_210;
  string local_1f0;
  MessageBuilder local_1c0;
  float local_3c;
  float local_38;
  float finalRatio;
  float ratio;
  int numFrag;
  int numVert;
  int i;
  int viewportH;
  int viewportW;
  int gridH;
  int gridW;
  float eps;
  float fragmentsPerVertices_local;
  ShaderPerformanceCase *this_local;
  
  gridH = 0x3c23d70a;
  viewportW = 0xff;
  viewportH = 0xff;
  gridW = (int)fragmentsPerVertices;
  _eps = this;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  i = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  numVert = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  for (numFrag = 0; numFrag < 10; numFrag = numFrag + 1) {
    ratio = (float)((viewportW + 1) * (viewportH + 1));
    finalRatio = (float)(i * numVert);
    local_38 = (float)(int)finalRatio / (float)(int)ratio;
    fVar3 = de::abs<float>(local_38 - (float)gridW);
    if (fVar3 < 0.01) break;
    if ((float)gridW <= local_38) {
      finalRatio = (float)deRoundFloatToInt32((float)(int)ratio * (float)gridW);
      while ((int)finalRatio < i * numVert) {
        if (numVert < i) {
          i = i + -1;
        }
        else {
          numVert = numVert + -1;
        }
      }
    }
    else {
      ratio = (float)deRoundFloatToInt32((float)(int)finalRatio / (float)gridW);
      while ((int)ratio < (viewportW + 1) * (viewportH + 1)) {
        if (viewportH < viewportW) {
          viewportW = viewportW + -1;
        }
        else {
          viewportH = viewportH + -1;
        }
      }
    }
  }
  local_3c = (float)(i * numVert) / (float)((viewportW + 1) * (viewportH + 1));
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1c0,(char (*) [34])"Requested fragment/vertex-ratio: ");
  de::floatToString_abi_cxx11_(&local_1f0,(de *)0x2,(float)gridW,precision);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x12b9f11);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [33])"Computed fragment/vertex-ratio: ")
  ;
  de::floatToString_abi_cxx11_(&local_210,(de *)0x2,local_3c,precision_00);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_210);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  setGridSize(this,viewportW,viewportH);
  setViewportSize(this,i,numVert);
  return;
}

Assistant:

void ShaderPerformanceCase::setVertexFragmentRatio (float fragmentsPerVertices)
{
	const float	eps			= 0.01f;
	int			gridW		= 255;
	int			gridH		= 255;
	int			viewportW	= m_renderCtx.getRenderTarget().getWidth();
	int			viewportH	= m_renderCtx.getRenderTarget().getHeight();

	for (int i = 0; i < 10; i++)
	{
		int		numVert	= (gridW+1)*(gridH+1);
		int		numFrag	= viewportW*viewportH;
		float	ratio	= (float)numFrag / (float)numVert;

		if (de::abs(ratio - fragmentsPerVertices) < eps)
			break;
		else if (ratio < fragmentsPerVertices)
		{
			// Not enough fragments.
			numVert = deRoundFloatToInt32((float)numFrag / fragmentsPerVertices);

			while ((gridW+1)*(gridH+1) > numVert)
			{
				if (gridW > gridH)
					gridW -= 1;
				else
					gridH -= 1;
			}
		}
		else
		{
			// Not enough vertices.
			numFrag = deRoundFloatToInt32((float)numVert * fragmentsPerVertices);

			while (viewportW*viewportH > numFrag)
			{
				if (viewportW > viewportH)
					viewportW -= 1;
				else
					viewportH -= 1;
			}
		}
	}

	float finalRatio = (float)(viewportW*viewportH) / (float)((gridW+1)*(gridH+1));
	m_testCtx.getLog() << TestLog::Message << "Requested fragment/vertex-ratio: " << de::floatToString(fragmentsPerVertices, 2) << "\n"
										   << "Computed fragment/vertex-ratio: " << de::floatToString(finalRatio, 2)
					   << TestLog::EndMessage;

	setGridSize(gridW, gridH);
	setViewportSize(viewportW, viewportH);
}